

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

TwoWayPipe * kj::newTwoWayPipe(void)

{
  uint *puVar1;
  TwoWayPipeEnd *pTVar2;
  TwoWayPipe *in_RDI;
  Own<kj::(anonymous_namespace)::TwoWayPipeEnd> end2;
  Own<kj::(anonymous_namespace)::TwoWayPipeEnd> end1;
  Own<kj::(anonymous_namespace)::AsyncPipe> pipe2;
  Own<kj::(anonymous_namespace)::AsyncPipe> pipe1;
  Own<kj::(anonymous_namespace)::AsyncPipe> local_58;
  Own<kj::(anonymous_namespace)::TwoWayPipeEnd> local_48;
  Own<kj::(anonymous_namespace)::AsyncPipe> local_38;
  Own<kj::(anonymous_namespace)::AsyncPipe> local_28;
  Own<kj::(anonymous_namespace)::AsyncPipe> local_18;
  
  refcounted<kj::(anonymous_namespace)::AsyncPipe>();
  refcounted<kj::(anonymous_namespace)::AsyncPipe>();
  puVar1 = &((local_28.ptr)->super_Refcounted).refcount;
  *puVar1 = *puVar1 + 1;
  local_58.disposer = &((local_28.ptr)->super_Refcounted).super_Disposer;
  local_58.ptr = local_28.ptr;
  puVar1 = &((local_38.ptr)->super_Refcounted).refcount;
  *puVar1 = *puVar1 + 1;
  local_18.disposer = &((local_38.ptr)->super_Refcounted).super_Disposer;
  local_18.ptr = local_38.ptr;
  heap<kj::(anonymous_namespace)::TwoWayPipeEnd,kj::Own<kj::(anonymous_namespace)::AsyncPipe>,kj::Own<kj::(anonymous_namespace)::AsyncPipe>>
            ((kj *)&local_48,&local_58,&local_18);
  Own<kj::(anonymous_namespace)::AsyncPipe>::~Own(&local_18);
  Own<kj::(anonymous_namespace)::AsyncPipe>::~Own(&local_58);
  heap<kj::(anonymous_namespace)::TwoWayPipeEnd,kj::Own<kj::(anonymous_namespace)::AsyncPipe>,kj::Own<kj::(anonymous_namespace)::AsyncPipe>>
            ((kj *)&local_58,&local_38,&local_28);
  pTVar2 = local_48.ptr;
  local_48.ptr = (TwoWayPipeEnd *)0x0;
  in_RDI->ends[0].disposer = local_48.disposer;
  in_RDI->ends[0].ptr = &pTVar2->super_AsyncIoStream;
  in_RDI->ends[1].disposer = local_58.disposer;
  in_RDI->ends[1].ptr = &(local_58.ptr)->super_AsyncIoStream;
  local_58.ptr = (AsyncPipe *)0x0;
  Own<kj::(anonymous_namespace)::TwoWayPipeEnd>::~Own
            ((Own<kj::(anonymous_namespace)::TwoWayPipeEnd> *)&local_58);
  Own<kj::(anonymous_namespace)::TwoWayPipeEnd>::~Own(&local_48);
  Own<kj::(anonymous_namespace)::AsyncPipe>::~Own(&local_38);
  Own<kj::(anonymous_namespace)::AsyncPipe>::~Own(&local_28);
  return in_RDI;
}

Assistant:

TwoWayPipe newTwoWayPipe() {
  auto pipe1 = kj::refcounted<AsyncPipe>();
  auto pipe2 = kj::refcounted<AsyncPipe>();
  auto end1 = kj::heap<TwoWayPipeEnd>(kj::addRef(*pipe1), kj::addRef(*pipe2));
  auto end2 = kj::heap<TwoWayPipeEnd>(kj::mv(pipe2), kj::mv(pipe1));
  return { { kj::mv(end1), kj::mv(end2) } };
}